

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FSingleLumpFont::LoadBMF(FSingleLumpFont *this,int lump,BYTE *data)

{
  ushort uVar1;
  long lVar2;
  CharData *pCVar3;
  ulong uVar4;
  BYTE *pBVar5;
  FFontChar2 *this_00;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  PalEntry sort_palette [256];
  BYTE raw_palette [768];
  int local_76c;
  uint local_768;
  int local_740;
  byte abStack_738 [7];
  byte local_731 [1017];
  undefined1 local_338 [2];
  byte local_336;
  byte abStack_335 [773];
  
  this->FontType = BMFFONT;
  (this->super_FFont).FontHeight = (uint)data[5];
  (this->super_FFont).GlobalKerning = (int)(char)data[8];
  bVar6 = data[0x10];
  (this->super_FFont).ActiveColors = (uint)bVar6;
  (this->super_FFont).SpaceWidth = -1;
  this->RescalePalette = true;
  lVar10 = (ulong)bVar6 * 3;
  lVar10 = (ulong)data[lVar10 + 0x11] + lVar10;
  lVar2 = lVar10 + 0x14;
  uVar1 = *(ushort *)(data + lVar10 + 0x12);
  uVar12 = (uint)uVar1;
  (this->super_FFont).FirstChar = 0x100;
  (this->super_FFont).LastChar = 0;
  if (uVar1 == 0) {
    local_76c = 0;
LAB_0048f35d:
    I_FatalError("BMF font defines no characters");
    uVar11 = (this->super_FFont).FirstChar;
    uVar16 = (this->super_FFont).LastChar;
  }
  else {
    uVar11 = 0x100;
    local_76c = 0;
    uVar4 = 0;
    uVar16 = 0;
    uVar7 = (uint)uVar1;
    do {
      bVar6 = data[uVar4 + lVar10 + 0x15];
      if (((bVar6 != 0) && (data[uVar4 + lVar10 + 0x16] != '\0')) ||
         (data[uVar4 + lVar10 + 0x19] != '\0')) {
        uVar14 = (uint)data[uVar4 + lVar2];
        if (data[uVar4 + lVar2] < uVar11) {
          (this->super_FFont).FirstChar = uVar14;
          uVar11 = uVar14;
          uVar14 = (uint)data[uVar4 + lVar2];
        }
        if (uVar16 < uVar14) {
          (this->super_FFont).LastChar = uVar14;
          uVar16 = uVar14;
        }
        bVar6 = data[uVar4 + lVar10 + 0x15];
        local_76c = local_76c + (uint)bVar6;
      }
      uVar4 = (ulong)((int)uVar4 + (uint)data[uVar4 + lVar10 + 0x16] * (uint)bVar6 + 6);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    local_76c = local_76c * 2;
    if (uVar16 < uVar11) goto LAB_0048f35d;
  }
  iVar15 = uVar16 - uVar11;
  uVar4 = 0xffffffffffffffff;
  if (-2 < iVar15) {
    uVar4 = (long)iVar15 * 0x10 + 0x10;
  }
  pCVar3 = (CharData *)operator_new__(uVar4);
  (this->super_FFont).Chars = pCVar3;
  if (-1 < iVar15) {
    lVar10 = 0;
    do {
      *(undefined8 *)((long)&pCVar3->Pic + lVar10) = 0;
      *(undefined4 *)((long)&pCVar3->XMove + lVar10) = 0x80000000;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar15 + 1U) << 4 != lVar10);
  }
  iVar13 = (this->super_FFont).ActiveColors;
  if (0 < (long)iVar13) {
    uVar4 = 1;
    if (1 < iVar13 * 3) {
      uVar4 = (ulong)(uint)(iVar13 * 3);
    }
    uVar8 = 0;
    do {
      abStack_335[uVar8] = data[uVar8 + 0x11] >> 4 | data[uVar8 + 0x11] * '\x04';
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  (this->super_FFont).ActiveColors = iVar13 + 1U;
  if (-1 < iVar13) {
    pbVar9 = &local_336;
    uVar4 = 0;
    do {
      abStack_738[uVar4 * 4 + 3] = (byte)uVar4;
      abStack_738[uVar4 * 4 + 2] = pbVar9[-2];
      abStack_738[uVar4 * 4 + 1] = pbVar9[-1];
      abStack_738[uVar4 * 4] = *pbVar9;
      uVar4 = uVar4 + 1;
      pbVar9 = pbVar9 + 3;
    } while (iVar13 + 1U != uVar4);
  }
  qsort(abStack_738 + 4,(long)iVar13,4,BMFCompare);
  uVar4 = (ulong)(this->super_FFont).ActiveColors;
  pBVar5 = (BYTE *)operator_new__(uVar4);
  (this->super_FFont).PatchRemap = pBVar5;
  *pBVar5 = '\0';
  if (1 < (long)uVar4) {
    lVar10 = 1;
    do {
      (this->super_FFont).PatchRemap[abStack_738[lVar10 * 4 + 3]] = (BYTE)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->super_FFont).ActiveColors);
  }
  memcpy(this->PaletteData,local_338,0x300);
  if (uVar1 == 0) {
    if (-1 < (this->super_FFont).SpaceWidth) goto LAB_0048f60d;
LAB_0048f5fb:
    local_768 = local_76c / (int)((iVar15 + 1U) * 3);
  }
  else {
    uVar4 = (ulong)(uint)(this->super_FFont).FirstChar;
    uVar11 = 0;
    local_768 = 0xffffffff;
    do {
      bVar6 = data[(ulong)uVar11 + lVar2];
      iVar13 = (uint)bVar6 - (int)uVar4;
      if (iVar13 < 0) {
        __assert_fail("chardata[chari] - FirstChar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                      ,0x507,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
      }
      if (iVar15 < iVar13) {
        __assert_fail("chardata[chari] - FirstChar < count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                      ,0x508,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
      }
      pbVar9 = data + (ulong)uVar11 + lVar2;
      if (bVar6 == 0x4e) {
        local_768 = (uint)pbVar9[5];
        bVar6 = 0x4e;
      }
      else if (bVar6 == 0x20) {
        (this->super_FFont).SpaceWidth = (uint)pbVar9[5];
        bVar6 = *pbVar9;
      }
      (this->super_FFont).Chars[(int)((uint)bVar6 - (int)uVar4)].XMove = (uint)pbVar9[5];
      uVar16 = (uint)pbVar9[1];
      if (pbVar9[1] == 0) {
        uVar16 = 0;
      }
      else {
        bVar6 = pbVar9[2];
        if (bVar6 != 0) {
          this_00 = (FFontChar2 *)operator_new(0x78);
          local_740 = (int)data;
          FFontChar2::FFontChar2
                    (this_00,lump,((int)pbVar9 - local_740) + 6,uVar16,(uint)bVar6,
                     -(int)(char)pbVar9[3],-(int)(char)pbVar9[4]);
          uVar4 = (ulong)(this->super_FFont).FirstChar;
          (this->super_FFont).Chars[*pbVar9 - uVar4].Pic = (FTexture *)this_00;
          uVar16 = (uint)pbVar9[1];
        }
      }
      uVar11 = uVar11 + pbVar9[2] * uVar16 + 6;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    if (-1 < (this->super_FFont).SpaceWidth) goto LAB_0048f60d;
    if ((int)local_768 < 0) goto LAB_0048f5fb;
  }
  (this->super_FFont).SpaceWidth = local_768;
LAB_0048f60d:
  FFont::FixXMoves(&this->super_FFont);
  (*(this->super_FFont)._vptr_FFont[4])(this);
  return;
}

Assistant:

void FSingleLumpFont::LoadBMF(int lump, const BYTE *data)
{
	const BYTE *chardata;
	int numchars, count, totalwidth, nwidth;
	int infolen;
	int i, chari;
	BYTE raw_palette[256*3];
	PalEntry sort_palette[256];

	FontType = BMFFONT;
	FontHeight = data[5];
	GlobalKerning = (SBYTE)data[8];
	ActiveColors = data[16];
	SpaceWidth = -1;
	nwidth = -1;
	RescalePalette = true;

	infolen = data[17 + ActiveColors*3];
	chardata = data + 18 + ActiveColors*3 + infolen;
	numchars = chardata[0] + 256*chardata[1];
	chardata += 2;

	// Scan for lowest and highest characters defined and total font width.
	FirstChar = 256;
	LastChar = 0;
	totalwidth = 0;
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		if ((chardata[chari+1] == 0 || chardata[chari+2] == 0) && chardata[chari+5] == 0)
		{ // Don't count empty characters.
			continue;
		}
		if (chardata[chari] < FirstChar)
		{
			FirstChar = chardata[chari];
		}
		if (chardata[chari] > LastChar)
		{
			LastChar = chardata[chari];
		}
		totalwidth += chardata[chari+1];
	}
	if (LastChar < FirstChar)
	{
		I_FatalError("BMF font defines no characters");
	}
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	for (i = 0; i < count; ++i)
	{
		Chars[i].Pic = NULL;
		Chars[i].XMove = INT_MIN;
	}

	// BMF palettes are only six bits per component. Fix that.
	for (i = 0; i < ActiveColors*3; ++i)
	{
		raw_palette[i+3] = (data[17 + i] << 2) | (data[17 + i] >> 4);
	}
	ActiveColors++;

	// Sort the palette by increasing brightness
	for (i = 0; i < ActiveColors; ++i)
	{
		PalEntry *pal = &sort_palette[i];
		pal->a = i;		// Use alpha part to point back to original entry
		pal->r = raw_palette[i*3 + 0];
		pal->g = raw_palette[i*3 + 1];
		pal->b = raw_palette[i*3 + 2];
	}
	qsort(sort_palette + 1, ActiveColors - 1, sizeof(PalEntry), BMFCompare);

	// Create the PatchRemap table from the sorted "alpha" values.
	PatchRemap = new BYTE[ActiveColors];
	PatchRemap[0] = 0;
	for (i = 1; i < ActiveColors; ++i)
	{
		PatchRemap[sort_palette[i].a] = i;
	}

	memcpy(PaletteData, raw_palette, 768);

	// Now scan through the characters again, creating glyphs for each one.
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		assert(chardata[chari] - FirstChar >= 0);
		assert(chardata[chari] - FirstChar < count);
		if (chardata[chari] == ' ')
		{
			SpaceWidth = chardata[chari+5];
		}
		else if (chardata[chari] == 'N')
		{
			nwidth = chardata[chari+5];
		}
		Chars[chardata[chari] - FirstChar].XMove = chardata[chari+5];
		if (chardata[chari+1] == 0 || chardata[chari+2] == 0)
		{ // Empty character: skip it.
			continue;
		}
		Chars[chardata[chari] - FirstChar].Pic = new FFontChar2(lump, int(chardata + chari + 6 - data),
			chardata[chari+1],	// width
			chardata[chari+2],	// height
			-(SBYTE)chardata[chari+3],	// x offset
			-(SBYTE)chardata[chari+4]	// y offset
		);
	}

	// If the font did not define a space character, determine a suitable space width now.
	if (SpaceWidth < 0)
	{
		if (nwidth >= 0)
		{
			SpaceWidth = nwidth;
		}
		else
		{
			SpaceWidth = totalwidth * 2 / (3 * count);
		}
	}

	FixXMoves();
	LoadTranslations();
}